

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void WriteArrayVars(FILE *file,FWorldGlobalArray *vars,uint count,DWORD id)

{
  bool bVar1;
  hash_t hVar2;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  uint count_00;
  ulong uVar3;
  ulong uVar4;
  FWorldGlobalArray *this_00;
  Pair *pair;
  ConstIterator it;
  FPNGChunkArchive arc;
  ConstPair *local_348;
  TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_> local_340;
  FPNGChunkArchive local_330;
  
  uVar4 = 0;
  this_00 = vars;
  while( true ) {
    if (count == uVar4) {
      return;
    }
    hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this_00);
    if (hVar2 != 0) break;
    uVar4 = uVar4 + 1;
    this_00 = this_00 + 1;
  }
  uVar3 = (ulong)(count - 1);
  this = vars + uVar3;
  do {
    count_00 = (uint)uVar3;
    if (count_00 <= (uint)uVar4) break;
    hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this);
    uVar3 = (ulong)(count_00 - 1);
    this = this + -1;
  } while (hVar2 == 0);
  FPNGChunkArchive::FPNGChunkArchive(&local_330,file,id);
  FArchive::WriteCount(&local_330.super_FArchive,(uint)uVar4);
  FArchive::WriteCount(&local_330.super_FArchive,count_00);
  for (; (uint)uVar4 <= count_00; uVar4 = (ulong)((uint)uVar4 + 1)) {
    hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(vars + (uVar4 & 0xffffffff));
    FArchive::WriteCount(&local_330.super_FArchive,hVar2);
    local_340.Position = 0;
    local_340.Map = vars + (uVar4 & 0xffffffff);
    while (bVar1 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::
                   NextPair(&local_340,&local_348), bVar1) {
      FArchive::WriteCount(&local_330.super_FArchive,local_348->Key);
      FArchive::WriteCount(&local_330.super_FArchive,local_348->Value);
    }
  }
  FPNGChunkArchive::~FPNGChunkArchive(&local_330);
  return;
}

Assistant:

static void WriteArrayVars (FILE *file, FWorldGlobalArray *vars, unsigned int count, DWORD id)
{
	unsigned int i, j;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-empty array. Anything beyond the last stored array
		// will be emptied at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j].CountUsed() != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		arc.WriteCount (i);
		arc.WriteCount (j);
		for (; i <= j; ++i)
		{
			arc.WriteCount (vars[i].CountUsed());

			FWorldGlobalArray::ConstIterator it(vars[i]);
			const FWorldGlobalArray::Pair *pair;

			while (it.NextPair (pair))
			{
				arc.WriteCount (pair->Key);
				arc.WriteCount (pair->Value);
			}
		}
	}
}